

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text.cpp
# Opt level: O0

string * formatHex_abi_cxx11_(string *__return_storage_ptr__,int value)

{
  long local_1a0;
  stringstream s;
  ostream local_190 [380];
  int local_14;
  string *psStack_10;
  int value_local;
  
  local_14 = value;
  psStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::ios_base::setf((ios_base *)((long)&local_1a0 + *(long *)(local_1a0 + -0x18)),_S_hex,
                      _S_basefield);
  std::ostream::operator<<(local_190,local_14);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

const std::string formatHex (int value)
{
  std::stringstream s;
  s.setf (std::ios::hex, std::ios::basefield);
  s << value;
  return s.str ();
}